

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,
          vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other)

{
  size_t sVar1;
  
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->ptr = (float *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  sVar1 = other->nStored;
  this->nAlloc = other->nAlloc;
  this->nStored = sVar1;
  this->ptr = other->ptr;
  other->nStored = 0;
  other->ptr = (float *)0x0;
  other->nAlloc = 0;
  return;
}

Assistant:

vector(vector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;

        other.nStored = other.nAlloc = 0;
        other.ptr = nullptr;
    }